

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

bool __thiscall Tetris::isValid(Tetris *this,int x,int y,int o)

{
  int iVar1;
  int iVar2;
  int local_3c;
  int local_38;
  int local_34;
  int tmpY;
  int tmpX;
  int i;
  int o_local;
  int y_local;
  int x_local;
  Tetris *this_local;
  bool local_1;
  
  local_34 = x;
  if (x == -1) {
    local_34 = this->blockX;
  }
  local_38 = y;
  if (y == -1) {
    local_38 = this->blockY;
  }
  local_3c = o;
  if (o == -1) {
    local_3c = this->orientation;
  }
  if ((local_3c < 0) || (3 < local_3c)) {
    local_1 = false;
  }
  else {
    for (i = 0; i < 4; i = i + 1) {
      iVar1 = local_34 + this->shape[local_3c][i << 1];
      iVar2 = local_38 + this->shape[local_3c][i * 2 + 1];
      if ((((iVar1 < 1) || (10 < iVar2)) || (iVar2 < 1)) ||
         ((0x14 < iVar1 || (this->gameBoard->gridInfo[this->color][iVar1][iVar2] != 0)))) {
        return false;
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Tetris::isValid(int x, int y, int o)
{
    x = x == -1 ? blockX : x;
    y = y == -1 ? blockY : y;
    o = o == -1 ? orientation : o;
    if (o < 0 || o > 3)
        return false;

    int i, tmpX, tmpY;
    for (i = 0; i < 4; i++) {
        tmpX = x + shape[o][2 * i];
        tmpY = y + shape[o][2 * i + 1];
        if (tmpX < 1 || tmpY > MAPWIDTH ||
            tmpY < 1 || tmpX > MAPHEIGHT ||
            gameBoard->gridInfo[color][tmpX][tmpY] != 0)
            return false;
    }
    return true;
}